

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_common.c
# Opt level: O2

EGLDisplay get_egl_display_or_skip(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  EGLDisplay pvVar4;
  EGLDisplay unaff_RBX;
  char *pcVar5;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined4 uStack_68;
  undefined1 auStack_64 [4];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined8 uStack_3c;
  EGLDisplay pvStack_30;
  undefined8 uVar6;
  EGLint minor;
  EGLint major;
  
  lVar3 = XOpenDisplay(0);
  if (lVar3 == 0) {
    pcVar5 = "couldn\'t open display\n";
    uVar6 = 0x4d;
  }
  else {
    pvVar4 = (EGLDisplay)(*_epoxy_eglGetDisplay)(lVar3);
    if (pvVar4 == (EGLDisplay)0x0) {
      pcVar5 = "Couldn\'t get EGL display for X11 Display.\n";
    }
    else {
      iVar2 = (*_epoxy_eglInitialize)(pvVar4,&major,&minor);
      if (iVar2 != 0) {
        return pvVar4;
      }
      pcVar5 = "eglInitialize() failed\n";
      unaff_RBX = pvVar4;
    }
    uVar6 = 1;
  }
  errx(uVar6,pcVar5);
  pvStack_30 = unaff_RBX;
  pvVar4 = get_egl_display_or_skip();
  uStack_70 = 0x100003098;
  uStack_68 = 0x3038;
  uStack_40 = 0x3040;
  uStack_3c = 0x303800000001;
  uStack_50 = 0x100003023;
  uStack_48 = 0x3022;
  uStack_44 = 1;
  uStack_60 = 0x3033;
  uStack_5c = 4;
  uStack_58 = 0x3024;
  uStack_54 = 1;
  _epoxy_eglBindAPI = override_eglBindAPI;
  _epoxy_eglGetError = override_eglGetError;
  cVar1 = epoxy_has_egl_extension(pvVar4,"EGL_KHR_surfaceless_context");
  if (cVar1 == '\0') {
    pcVar5 = "Test requires EGL_KHR_surfaceless_context";
LAB_00101331:
    errx(0x4d,pcVar5);
  }
  else {
    (*_epoxy_eglBindAPI)(0x30a0);
    iVar2 = (*_epoxy_eglChooseConfig)(pvVar4,&uStack_60,&uStack_78,1,auStack_64);
    if (iVar2 == 0) {
      pcVar5 = "Couldn\'t get an EGLConfig\n";
      goto LAB_00101331;
    }
    lVar3 = (*_epoxy_eglCreateContext)(pvVar4,uStack_78,0,&uStack_70);
    if (lVar3 != 0) {
      (*_epoxy_eglMakeCurrent)(pvVar4,0,0,lVar3);
      uVar6 = (*_epoxy_glGetString)(0x1f02);
      printf("GL_VERSION: %s\n",uVar6);
      iVar2 = (*_epoxy_eglGetError)();
      if (iVar2 == 0x3000) {
        return (EGLDisplay)0x0;
      }
      goto LAB_0010134f;
    }
  }
  errx(0x4d,"Couldn\'t create a GLES%d context\n",1);
LAB_0010134f:
  __assert_fail("eglGetError() == EGL_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/yaronct[P]libepoxy/test/egl_without_glx.c"
                ,0x87,"int main(void)");
}

Assistant:

EGLDisplay 
get_egl_display_or_skip(void)
{
    Display *dpy = XOpenDisplay(NULL);
    EGLint major, minor;
    EGLDisplay edpy;
    bool ok;

    if (!dpy)
        errx(77, "couldn't open display\n");
    edpy = eglGetDisplay((EGLNativeDisplayType)dpy);
    if (edpy == EGL_NO_DISPLAY)
        errx(1, "Couldn't get EGL display for X11 Display.\n");

    ok = eglInitialize(edpy, &major, &minor);
    if (!ok)
        errx(1, "eglInitialize() failed\n");

    return edpy;
}